

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames__passthrough
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint64 local_88;
  ma_uint64 frameCount;
  ma_uint64 frameCountOut;
  ma_uint64 frameCountIn;
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_data_converter *pConverter_local;
  
  if (pConverter == (ma_data_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x86d1,
                  "ma_result ma_data_converter_process_pcm_frames__passthrough(ma_data_converter *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                 );
  }
  frameCountOut = 0;
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    frameCountOut = *pFrameCountIn;
  }
  frameCount = 0;
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    frameCount = *pFrameCountOut;
  }
  if (frameCountOut < frameCount) {
    local_88 = frameCountOut;
  }
  else {
    local_88 = frameCount;
  }
  if (pFramesOut != (void *)0x0) {
    if (pFramesIn == (void *)0x0) {
      mVar1 = (pConverter->config).channelsOut;
      mVar2 = ma_get_bytes_per_sample((pConverter->config).formatOut);
      memset(pFramesOut,0,local_88 * (mVar2 * mVar1));
    }
    else {
      mVar1 = (pConverter->config).channelsOut;
      mVar2 = ma_get_bytes_per_sample((pConverter->config).formatOut);
      memcpy(pFramesOut,pFramesIn,local_88 * (mVar2 * mVar1));
    }
  }
  if (pFrameCountIn != (ma_uint64 *)0x0) {
    *pFrameCountIn = local_88;
  }
  if (pFrameCountOut != (ma_uint64 *)0x0) {
    *pFrameCountOut = local_88;
  }
  return 0;
}

Assistant:

static ma_result ma_data_converter_process_pcm_frames__passthrough(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    ma_uint64 frameCountIn;
    ma_uint64 frameCountOut;
    ma_uint64 frameCount;

    MA_ASSERT(pConverter != NULL);
    
    frameCountIn = 0;
    if (pFrameCountIn != NULL) {
        frameCountIn = *pFrameCountIn;
    }

    frameCountOut = 0;
    if (pFrameCountOut != NULL) {
        frameCountOut = *pFrameCountOut;
    }

    frameCount = ma_min(frameCountIn, frameCountOut);

    if (pFramesOut != NULL) {
        if (pFramesIn != NULL) {
            ma_copy_memory_64(pFramesOut, pFramesIn, frameCount * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
        } else {
            ma_zero_memory_64(pFramesOut,            frameCount * ma_get_bytes_per_frame(pConverter->config.formatOut, pConverter->config.channelsOut));
        }
    }

    if (pFrameCountIn != NULL) {
        *pFrameCountIn = frameCount;
    }
    if (pFrameCountOut != NULL) {
        *pFrameCountOut = frameCount;
    }

    return MA_SUCCESS;
}